

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSparseSDF.h
# Opt level: O2

int __thiscall btSparseSdf<3>::RemoveReferences(btSparseSdf<3> *this,btCollisionShape *pcs)

{
  Cell **ppCVar1;
  int iVar2;
  Cell *pCVar3;
  Cell *pCVar4;
  Cell **ppCVar5;
  int i;
  long lVar6;
  bool bVar7;
  
  lVar6 = 0;
  iVar2 = 0;
LAB_001a9f1b:
  if ((this->cells).m_size <= lVar6) {
    return iVar2;
  }
  ppCVar1 = (this->cells).m_data + lVar6;
  pCVar4 = *ppCVar1;
  pCVar3 = (Cell *)0x0;
  do {
    ppCVar5 = &pCVar3->next;
    bVar7 = pCVar3 == (Cell *)0x0;
    pCVar3 = pCVar4;
    if (bVar7) {
      ppCVar5 = ppCVar1;
    }
    while( true ) {
      if (pCVar3 == (Cell *)0x0) {
        lVar6 = lVar6 + 1;
        goto LAB_001a9f1b;
      }
      pCVar4 = pCVar3->next;
      if (pCVar3->pclient != pcs) break;
      *ppCVar5 = pCVar4;
      ::operator_delete(pCVar3);
      iVar2 = iVar2 + 1;
      pCVar3 = pCVar4;
    }
  } while( true );
}

Assistant:

int						RemoveReferences(btCollisionShape* pcs)
	{
		int	refcount=0;
		for(int i=0;i<cells.size();++i)
		{
			Cell*&	root=cells[i];
			Cell*	pp=0;
			Cell*	pc=root;
			while(pc)
			{
				Cell*	pn=pc->next;
				if(pc->pclient==pcs)
				{
					if(pp) pp->next=pn; else root=pn;
					delete pc;pc=pp;++refcount;
				}
				pp=pc;pc=pn;
			}
		}
		return(refcount);
	}